

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int cbs_get_any_asn1_element
              (CBS *cbs,CBS *out,CBS_ASN1_TAG *out_tag,size_t *out_header_len,int *out_ber_found,
              int *out_indefinite,int ber_ok)

{
  uint8_t uVar1;
  char cVar2;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  CBS_ASN1_TAG tag;
  uint local_54;
  CBS *local_50;
  CBS local_48;
  
  local_48.data = cbs->data;
  local_48.len = cbs->len;
  local_50 = out;
  if (ber_ok == 0) {
    if (out_ber_found != (int *)0x0) {
      __assert_fail("out_ber_found == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x13f,
                    "int cbs_get_any_asn1_element(CBS *, CBS *, CBS_ASN1_TAG *, size_t *, int *, int *, int)"
                   );
    }
    if (out_indefinite != (int *)0x0) {
      __assert_fail("out_indefinite == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x140,
                    "int cbs_get_any_asn1_element(CBS *, CBS *, CBS_ASN1_TAG *, size_t *, int *, int *, int)"
                   );
    }
  }
  else {
    *out_ber_found = 0;
    *out_indefinite = 0;
  }
  iVar3 = parse_asn1_tag(&local_48,&local_54);
  if (iVar3 == 0) {
    return 0;
  }
  if (out_tag != (CBS_ASN1_TAG *)0x0) {
    *out_tag = local_54;
  }
  if (local_48.len == 0) {
    return 0;
  }
  uVar1 = *local_48.data;
  sVar8 = cbs->len;
  uVar5 = sVar8 - (local_48.len - 1);
  if ((long)(char)uVar1 < 0) {
    uVar6 = (ulong)((int)(char)uVar1 & 0x7fU);
    if (((ber_ok != 0) && (uVar6 == 0)) && ((local_54 & 0x20000000) != 0)) {
      if (out_header_len != (size_t *)0x0) {
        *out_header_len = uVar5;
        sVar8 = cbs->len;
      }
      *out_ber_found = 1;
      *out_indefinite = 1;
      if (sVar8 < uVar5) {
        return 0;
      }
      puVar4 = cbs->data;
      cbs->data = puVar4 + uVar5;
      cbs->len = sVar8 - uVar5;
      if (local_50 == (CBS *)0x0) {
        return 1;
      }
      goto LAB_00176995;
    }
    cVar2 = (char)((int)(char)uVar1 & 0x7fU);
    if (local_48.len - 1 < uVar6 || (byte)(cVar2 - 5U) < 0xfc) {
      return 0;
    }
    uVar9 = 0;
    uVar7 = 0;
    do {
      uVar7 = (ulong)local_48.data[uVar9 + 1] | uVar7 << 8;
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
    if (uVar7 < 0x80) {
      if (ber_ok == 0) {
        return 0;
      }
      *out_ber_found = 1;
      if (uVar7 >> (cVar2 * '\b' - 8U & 0x3f) == 0) {
LAB_00176a7c:
        *out_ber_found = 1;
      }
    }
    else if (uVar7 >> (cVar2 * '\b' - 8U & 0x3f) == 0) {
      if (ber_ok == 0) {
        return 0;
      }
      goto LAB_00176a7c;
    }
    uVar5 = uVar5 + uVar6;
    uVar6 = uVar7 + uVar5;
    if (CARRY8(uVar7,uVar5)) {
      return 0;
    }
  }
  else {
    uVar6 = (long)(char)uVar1 + uVar5;
  }
  if (out_header_len != (size_t *)0x0) {
    *out_header_len = uVar5;
  }
  if (cbs->len < uVar6) {
    return 0;
  }
  puVar4 = cbs->data;
  cbs->data = puVar4 + uVar6;
  cbs->len = cbs->len - uVar6;
  uVar5 = uVar6;
  if (local_50 == (CBS *)0x0) {
    return 1;
  }
LAB_00176995:
  local_50->data = puVar4;
  local_50->len = uVar5;
  return 1;
}

Assistant:

static int cbs_get_any_asn1_element(CBS *cbs, CBS *out, CBS_ASN1_TAG *out_tag,
                                    size_t *out_header_len, int *out_ber_found,
                                    int *out_indefinite, int ber_ok) {
  CBS header = *cbs;
  CBS throwaway;

  if (out == NULL) {
    out = &throwaway;
  }
  if (ber_ok) {
    *out_ber_found = 0;
    *out_indefinite = 0;
  } else {
    assert(out_ber_found == NULL);
    assert(out_indefinite == NULL);
  }

  CBS_ASN1_TAG tag;
  if (!parse_asn1_tag(&header, &tag)) {
    return 0;
  }
  if (out_tag != NULL) {
    *out_tag = tag;
  }

  uint8_t length_byte;
  if (!CBS_get_u8(&header, &length_byte)) {
    return 0;
  }

  size_t header_len = CBS_len(cbs) - CBS_len(&header);

  size_t len;
  // The format for the length encoding is specified in ITU-T X.690 section
  // 8.1.3.
  if ((length_byte & 0x80) == 0) {
    // Short form length.
    len = ((size_t)length_byte) + header_len;
    if (out_header_len != NULL) {
      *out_header_len = header_len;
    }
  } else {
    // The high bit indicate that this is the long form, while the next 7 bits
    // encode the number of subsequent octets used to encode the length (ITU-T
    // X.690 clause 8.1.3.5.b).
    const size_t num_bytes = length_byte & 0x7f;
    uint64_t len64;

    if (ber_ok && (tag & CBS_ASN1_CONSTRUCTED) != 0 && num_bytes == 0) {
      // indefinite length
      if (out_header_len != NULL) {
        *out_header_len = header_len;
      }
      *out_ber_found = 1;
      *out_indefinite = 1;
      return CBS_get_bytes(cbs, out, header_len);
    }

    // ITU-T X.690 clause 8.1.3.5.c specifies that the value 0xff shall not be
    // used as the first byte of the length. If this parser encounters that
    // value, num_bytes will be parsed as 127, which will fail this check.
    if (num_bytes == 0 || num_bytes > 4) {
      return 0;
    }
    if (!cbs_get_u(&header, &len64, num_bytes)) {
      return 0;
    }
    // ITU-T X.690 section 10.1 (DER length forms) requires encoding the
    // length with the minimum number of octets. BER could, technically, have
    // 125 superfluous zero bytes. We do not attempt to handle that and still
    // require that the length fit in a |uint32_t| for BER.
    if (len64 < 128) {
      // Length should have used short-form encoding.
      if (ber_ok) {
        *out_ber_found = 1;
      } else {
        return 0;
      }
    }
    if ((len64 >> ((num_bytes - 1) * 8)) == 0) {
      // Length should have been at least one byte shorter.
      if (ber_ok) {
        *out_ber_found = 1;
      } else {
        return 0;
      }
    }
    len = len64;
    if (len + header_len + num_bytes < len) {
      // Overflow.
      return 0;
    }
    len += header_len + num_bytes;
    if (out_header_len != NULL) {
      *out_header_len = header_len + num_bytes;
    }
  }

  return CBS_get_bytes(cbs, out, len);
}